

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Null_Test::Body
          (iu_SyntaxTest_x_iutest_x_Null_Test *this)

{
  AssertionResult iutest_ar;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined1 local_28;
  
  local_40 = 0;
  local_38[0] = 0;
  local_28 = 1;
  local_48 = local_38;
  std::__cxx11::string::~string((string *)&local_48);
  local_40 = 0;
  local_38[0] = 0;
  local_28 = 1;
  local_48 = local_38;
  std::__cxx11::string::~string((string *)&local_48);
  local_40 = 0;
  local_38[0] = 0;
  local_28 = 1;
  local_48 = local_38;
  std::__cxx11::string::~string((string *)&local_48);
  local_40 = 0;
  local_38[0] = 0;
  local_28 = 1;
  local_48 = local_38;
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

IUTEST(SyntaxTest, GT)
{
    if( int x = 1 )
        IUTEST_ASSERT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GT(2, x) << x;
}